

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR mergeforward(LispPTR base)

{
  ushort uVar1;
  LispPTR LVar2;
  uint base_00;
  
  LVar2 = 0;
  if ((base != 0) && (*ArrayMerging_word != 0)) {
    checkarrayblock(base,1,1);
    if ((base & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)base);
    }
    base_00 = base + (uint)Lisp_world[base] * 2;
    if ((base_00 != *ArrayFrLst_word) && (LVar2 = 0, base_00 != *ArrayFrLst2_word)) {
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)base_00);
      }
      uVar1 = Lisp_world[(ulong)base_00 + 1];
      checkarrayblock(base_00,uVar1 & 1 ^ 1,0);
      LVar2 = 0;
      if ((uVar1 & 1) == 0) {
        deleteblock(base_00);
        deleteblock(base);
        arrayblockmerger(base,base_00);
        LVar2 = base;
      }
    }
  }
  return LVar2;
}

Assistant:

LispPTR mergeforward(LispPTR base) {
  LispPTR nbase, nbinuse;
  struct arrayblock *bbase, *bnbase;
  if (*ArrayMerging_word == NIL) return NIL;
  if (base == NIL) return NIL;
  if (checkarrayblock(base, T, T)) return NIL;

  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  nbase = base + 2 * (bbase->arlen);
  if (nbase == *ArrayFrLst_word || nbase == *ArrayFrLst2_word) return NIL;

  bnbase = (struct arrayblock *)NativeAligned4FromLAddr(nbase);
  nbinuse = bnbase->inuse;
  if (checkarrayblock(nbase, !nbinuse, NIL)) return NIL;
  if (nbinuse) return (NIL);
  deleteblock(nbase);
  deleteblock(base);
  return (arrayblockmerger(base, nbase));
}